

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getnameinfo.c
# Opt level: O3

int run_test_getnameinfo_basic_ip4_sync(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x50,&addr4);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_getnameinfo(puVar2,&req,(uv_getnameinfo_cb)0x0,(sockaddr *)&addr4,0);
    if (iVar1 != 0) goto LAB_00159332;
    if (req.host[0] == '\0') goto LAB_00159337;
    if (req.service[0] == '\0') goto LAB_0015933c;
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_getnameinfo_basic_ip4_sync_cold_1();
LAB_00159332:
    run_test_getnameinfo_basic_ip4_sync_cold_2();
LAB_00159337:
    run_test_getnameinfo_basic_ip4_sync_cold_5();
LAB_0015933c:
    run_test_getnameinfo_basic_ip4_sync_cold_4();
  }
  run_test_getnameinfo_basic_ip4_sync_cold_3();
  puVar2 = (uv_loop_t *)0x199c19;
  iVar1 = uv_ip6_addr("::1",0x50,&addr6);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_getnameinfo(puVar2,&req,getnameinfo_req,(sockaddr *)&addr6,0);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001593dd;
    }
  }
  else {
    run_test_getnameinfo_basic_ip6_cold_1();
  }
  run_test_getnameinfo_basic_ip6_cold_2();
LAB_001593dd:
  run_test_getnameinfo_basic_ip6_cold_3();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(getnameinfo_basic_ip4_sync) {
  ASSERT(0 == uv_ip4_addr(address_ip4, port, &addr4));

  ASSERT(0 == uv_getnameinfo(uv_default_loop(),
                             &req,
                             NULL,
                             (const struct sockaddr*)&addr4,
                             0));
  ASSERT(req.host[0] != '\0');
  ASSERT(req.service[0] != '\0');

  MAKE_VALGRIND_HAPPY();
  return 0;
}